

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v64 c_v64_shr_u16(c_v64 a,uint n)

{
  c_v64 extraout_RAX;
  undefined1 auVar1 [16];
  undefined1 in_ZMM0 [64];
  
  auVar1 = in_ZMM0._0_16_;
  if (n < 0x10) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = a.u64;
    auVar1 = vpmovzxwd_avx(auVar1);
    auVar1 = vpsrld_avx(auVar1,ZEXT416(n));
    auVar1 = vpackusdw_avx(auVar1,auVar1);
    return (c_v64)auVar1._0_8_;
  }
  c_v64_shr_u16();
  vpsrlw_avx(auVar1,ZEXT416(n));
  return (c_v64)extraout_RAX.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_u16(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 15) {
    fprintf(stderr, "Error: Undefined u16 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 4; c++) t.u16[c] = a.u16[c] >> n;
  return t;
}